

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O2

void Prf_ManChainResolve(Prf_Man_t *p,clause *c)

{
  uint *puVar1;
  int iVar2;
  clause i;
  word *pwVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = p->iFirst;
  if (iVar2 < 0) {
    __assert_fail("p->iFirst >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xe0,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
  }
  if (p->pInfo != (word *)0x0) {
    i = c[(ulong)((uint)*c >> 0xb) + 1];
    if (((uint)*c & 1) == 0) {
      if (-1 < (int)i) {
        if ((p->vId2Pr != (Vec_Int_t *)0x0) &&
           (i = (clause)Vec_IntEntry(p->vId2Pr,(int)i), (int)i < 0)) {
          return;
        }
        if (p->nWords * 0x40 <= (int)i) {
          __assert_fail("Entry < 64 * p->nWords",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                        ,0xfb,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
        }
        puVar1 = (uint *)((long)p->pInfo + (ulong)((uint)i >> 5) * 4);
        *puVar1 = *puVar1 | 1 << (i._0_1_ & 0x1f);
      }
    }
    else if (iVar2 <= (int)i) {
      if (p->vInfo->nSize / p->nWords <= (int)i - iVar2) {
        __assert_fail("clause_id(c) - p->iFirst < Prf_ManSize(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xea,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
      }
      pwVar3 = Prf_ManClauseInfo(p,(int)i - iVar2);
      uVar5 = 0;
      uVar4 = (ulong)(uint)p->nWords;
      if (p->nWords < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        p->pInfo[uVar5] = p->pInfo[uVar5] | pwVar3[uVar5];
      }
    }
    return;
  }
  __assert_fail("p->pInfo != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                ,0xe1,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
}

Assistant:

static inline void Prf_ManChainResolve( Prf_Man_t * p, clause * c )
{
    assert( p->iFirst >= 0 );
    assert( p->pInfo != NULL );
    // add to proof info
    if ( c->lrn ) // learned clause
    {
        if ( clause_id(c) >= p->iFirst )
        {
            word * pProofStart;
            int w;
            assert( clause_id(c) - p->iFirst >= 0 );
            assert( clause_id(c) - p->iFirst < Prf_ManSize(p) ); 
            pProofStart = Prf_ManClauseInfo( p, clause_id(c) - p->iFirst );
            for ( w = 0; w < p->nWords; w++ )
                p->pInfo[w] |= pProofStart[w];
        }
    }
    else // problem clause
    {  
        if ( clause_id(c) >= 0 ) // has proof ID
        {
            int Entry;
            if ( p->vId2Pr == NULL )
                Entry = clause_id(c);
            else
                Entry = Vec_IntEntry( p->vId2Pr, clause_id(c) );
            if ( Entry >= 0 )
            {
                assert( Entry < 64 * p->nWords );
                Abc_InfoSetBit( (unsigned *)p->pInfo, Entry );
            }
        }
    }
}